

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentBG.cpp
# Opt level: O1

Index __thiscall AgentBG::GetMaximizingActionIndex(AgentBG *this,JointBeliefInterface *jb)

{
  long lVar1;
  ulong uVar2;
  Index IVar3;
  Index IVar4;
  ulong uVar5;
  uint uVar6;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  BGPolicyIndex bI;
  double local_40;
  undefined1 local_38 [8];
  undefined1 auVar7 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  lVar1 = (**(code **)((long)*(((this->super_AgentDelayedSharedObservations).
                                super_AgentDecPOMDPDiscrete._m_pu)->super_PlanningUnitMADPDiscrete).
                              _m_madp + 0x68))();
  if (lVar1 == 0) {
    IVar3 = 0x7fffffff;
  }
  else {
    local_40 = -1.79769313486232e+308;
    IVar3 = 0x7fffffff;
    uVar6 = 1;
    do {
      IVar4 = uVar6 - 1;
      if (this->_m_QBGstationary == (QAV<PerseusBGPlanner> *)0x0) {
        auVar9._0_8_ = (**(code **)(*(long *)(*(long *)(this->_m_QBGnonStationary + 8) + 0x18) +
                                   0x58))(*(long *)(this->_m_QBGnonStationary + 8) + 0x18,jb,
                                          (int)this->_m_t,IVar4,local_38);
        auVar9._8_56_ = extraout_var_00;
        auVar7 = auVar9._0_16_;
      }
      else {
        lVar1 = *(long *)(this->_m_QBGstationary + 8);
        auVar8._0_8_ = (**(code **)(*(long *)(lVar1 + 0x18) + 0x48))(lVar1 + 0x18,jb,IVar4,local_38)
        ;
        auVar8._8_56_ = extraout_var;
        auVar7 = auVar8._0_16_;
      }
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_40;
      auVar10 = vmaxsd_avx(auVar7,auVar10);
      if (local_40 < auVar7._0_8_) {
        IVar3 = IVar4;
      }
      uVar5 = (ulong)uVar6;
      uVar2 = (**(code **)((long)*(((this->super_AgentDelayedSharedObservations).
                                    super_AgentDecPOMDPDiscrete._m_pu)->
                                  super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
      uVar6 = uVar6 + 1;
      local_40 = auVar10._0_8_;
    } while (uVar2 != uVar5);
  }
  return IVar3;
}

Assistant:

Index AgentBG::GetMaximizingActionIndex(const JointBeliefInterface &jb) const
{
    double v=-DBL_MAX,q;
    Index ja=INT_MAX;
    AlphaVector::BGPolicyIndex bI;

    for(Index a=0;a!=GetPU()->GetNrJointActions();++a)
    {
        if(_m_QBGstationary)
            q=_m_QBGstationary->GetQ(jb,a,bI);
        else
            q=_m_QBGnonStationary->GetQ(jb,_m_t,a,bI);
        
        if(q>v)
        {
            v=q;
            ja=a;
        }
    }

    return(ja);
}